

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int luv_fs_sendfile(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  lua_Integer lVar4;
  lua_Integer off;
  size_t len;
  uv_fs_t *req;
  luv_req_t *plVar5;
  uv_loop_t *loop;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  code *cb;
  
  lVar3 = luaL_checkinteger(L,1);
  lVar4 = luaL_checkinteger(L,2);
  off = luaL_checkinteger(L,3);
  len = luaL_checkinteger(L,4);
  iVar1 = luv_check_continuation(L,5);
  req = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar5 = luv_setup_req(L,iVar1);
  req->data = plVar5;
  iVar1 = plVar5->callback_ref;
  loop = luv_loop(L);
  cb = (uv_fs_cb)0x0;
  if (iVar1 != -2) {
    cb = luv_fs_cb;
  }
  iVar2 = uv_fs_sendfile(loop,req,(uv_file)lVar3,(uv_file)lVar4,off,len,cb);
  if ((req->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
    if (iVar1 != -2) {
      lua_rawgeti(L,-0xf4628,(long)plVar5->req_ref);
      return 1;
    }
    iVar1 = push_fs_result(L,req);
    if (req->fs_type == UV_FS_SCANDIR) {
      return iVar1;
    }
  }
  else {
    lua_pushnil(L);
    pcVar8 = req->path;
    pcVar6 = uv_err_name((int)req->result);
    pcVar7 = uv_strerror((int)req->result);
    if (pcVar8 == (char *)0x0) {
      lua_pushfstring(L,"%s: %s",pcVar6,pcVar7);
    }
    else {
      lua_pushfstring(L,"%s: %s: %s",pcVar6,pcVar7,req->path);
    }
    iVar1 = 3;
    pcVar8 = uv_err_name((int)req->result);
    lua_pushstring(L,pcVar8);
  }
  luv_cleanup_req(L,(luv_req_t *)req->data);
  req->data = (void *)0x0;
  uv_fs_req_cleanup(req);
  return iVar1;
}

Assistant:

static int luv_fs_sendfile(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_file out_fd = luaL_checkinteger(L, 1);
  uv_file in_fd = luaL_checkinteger(L, 2);
  int64_t in_offset = luaL_checkinteger(L, 3);
  size_t length = luaL_checkinteger(L, 4);
  int ref = luv_check_continuation(L, 5);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  FS_CALL(sendfile, req, out_fd, in_fd, in_offset, length);
}